

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall TPZMatrix<float>::VerifySymmetry(TPZMatrix<float> *this,REAL tol)

{
  int64_t iVar1;
  int64_t iVar2;
  ostream *poVar3;
  void *this_00;
  TPZBaseMatrix *in_RDI;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  double in_XMM0_Qa;
  double dVar4;
  float exp;
  int64_t j;
  int64_t i;
  int64_t ncols;
  int64_t nrows;
  long local_38;
  long local_30;
  int local_4;
  
  iVar1 = TPZBaseMatrix::Rows(in_RDI);
  iVar2 = TPZBaseMatrix::Cols(in_RDI);
  if (iVar1 == iVar2) {
    for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
      for (local_38 = 0; local_38 <= local_30; local_38 = local_38 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_30,local_38);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_38,local_30);
        dVar4 = std::fabs((double)(ulong)(uint)(extraout_XMM0_Da - extraout_XMM0_Da_00));
        if (in_XMM0_Qa < (double)SUB84(dVar4,0)) {
          poVar3 = std::operator<<((ostream *)&std::cout,"Elemento: ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_30);
          poVar3 = std::operator<<(poVar3,", ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_38);
          poVar3 = std::operator<<(poVar3,"  -> ");
          poVar3 = (ostream *)
                   std::ostream::operator<<(poVar3,extraout_XMM0_Da - extraout_XMM0_Da_00);
          poVar3 = std::operator<<(poVar3,"/");
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_30,local_38);
          this_00 = (void *)std::ostream::operator<<(poVar3,extraout_XMM0_Da_01);
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
          return 0;
        }
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int TPZMatrix<TVar>::VerifySymmetry(REAL tol) const{
	int64_t nrows = this->Rows();
	int64_t ncols = this->Cols();
	if (nrows != ncols) return 0;
	
	for( int64_t i = 0; i < nrows; i++){
		for(int64_t j = 0; j <= i; j++){
            TVar exp = this->Get(i,j) - this->Get(j,i);
			if ( (REAL)(fabs( exp )) > tol ) {
			  	#ifdef STATE_COMPLEX
				cout << "Elemento: " << i << ", " << j << "  -> " << fabs( exp ) << "/" <<
				this->Get(i,j) << endl;
				#else
				cout << "Elemento: " << i << ", " << j << "  -> " << exp << "/" <<
				this->Get(i,j) << endl;
				#endif
				return 0;
			}
		}
	}
	return 1;
}